

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O1

void ScriptToUniv(CScript *script,UniValue *out,bool include_hex,bool include_address,
                 SigningProvider *provider)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  CScript *pCVar4;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  bool bVar5;
  TxoutType t;
  undefined3 in_register_00000009;
  undefined4 uVar6;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solns;
  CTxDestination address;
  undefined1 in_stack_fffffffffffffcd8 [12];
  undefined8 in_stack_fffffffffffffce8;
  undefined8 uVar7;
  undefined8 in_stack_fffffffffffffcf0;
  undefined8 uVar8;
  undefined8 in_stack_fffffffffffffcf8;
  undefined8 uVar9;
  undefined8 in_stack_fffffffffffffd00;
  _Alloc_hider in_stack_fffffffffffffd08;
  size_type in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd20 [48];
  long *local_2a8 [2];
  long local_298 [2];
  UniValue local_288;
  long *local_230 [2];
  long local_220 [2];
  UniValue local_210;
  long *local_1b8 [2];
  long local_1a8 [2];
  UniValue local_198;
  long *local_140 [2];
  long local_130 [2];
  string local_120;
  UniValue local_100;
  long *local_a8 [2];
  long local_98 [2];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_38;
  
  uVar6 = CONCAT31(in_register_00000009,include_address);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_40 = 0;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"asm","");
  ScriptToAsmStr_abi_cxx11_(&local_120,script,false);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_100,&local_120);
  key._M_string_length._4_4_ = uVar6;
  key._0_12_ = in_stack_fffffffffffffcd8;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffce8;
  key.field_2._8_8_ = in_stack_fffffffffffffcf0;
  val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd00;
  val._0_8_ = in_stack_fffffffffffffcf8;
  val.val._M_string_length = (size_type)in_stack_fffffffffffffd08._M_p;
  val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd10;
  val.val.field_2._8_8_ = in_stack_fffffffffffffd18;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffd20._0_24_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
       = (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd20._24_24_;
  UniValue::pushKV(out,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_100.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.val._M_dataplus._M_p != &local_100.val.field_2) {
    operator_delete(local_100.val._M_dataplus._M_p,local_100.val.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if ((char)uVar6 != '\0') {
    local_140[0] = local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"desc","");
    InferDescriptor((CScript *)&stack0xfffffffffffffce8,(SigningProvider *)script);
    (**(code **)(*(long *)in_stack_fffffffffffffce8 + 0x20))(&local_120,in_stack_fffffffffffffce8,0)
    ;
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_198,&local_120);
    key_00._M_string_length._4_4_ = uVar6;
    key_00._0_12_ = in_stack_fffffffffffffcd8;
    key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffce8;
    key_00.field_2._8_8_ = in_stack_fffffffffffffcf0;
    val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd00;
    val_00._0_8_ = in_stack_fffffffffffffcf8;
    val_00.val._M_string_length = (size_type)in_stack_fffffffffffffd08._M_p;
    val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd10;
    val_00.val.field_2._8_8_ = in_stack_fffffffffffffd18;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffd20._0_24_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd20._24_24_;
    UniValue::pushKV(out,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_198.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.val._M_dataplus._M_p != &local_198.val.field_2) {
      operator_delete(local_198.val._M_dataplus._M_p,local_198.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((long *)in_stack_fffffffffffffce8 != (long *)0x0) {
      (**(code **)(*(long *)in_stack_fffffffffffffce8 + 8))();
    }
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
  }
  if (include_hex) {
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"hex","");
    uVar2 = (script->super_CScriptBase)._size;
    uVar3 = uVar2 - 0x1d;
    pCVar4 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar2 < 0x1d) {
      uVar3 = uVar2;
      pCVar4 = script;
    }
    s.m_size._0_4_ = uVar3;
    s.m_data = (uchar *)pCVar4;
    s.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_120,s);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_210,&local_120);
    key_01._M_string_length._4_4_ = uVar6;
    key_01._0_12_ = in_stack_fffffffffffffcd8;
    key_01.field_2._M_allocated_capacity = in_stack_fffffffffffffce8;
    key_01.field_2._8_8_ = in_stack_fffffffffffffcf0;
    val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd00;
    val_01._0_8_ = in_stack_fffffffffffffcf8;
    val_01.val._M_string_length = (size_type)in_stack_fffffffffffffd08._M_p;
    val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd10;
    val_01.val.field_2._8_8_ = in_stack_fffffffffffffd18;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffd20._0_24_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd20._24_24_;
    UniValue::pushKV(out,key_01,val_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_210.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_210.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.val._M_dataplus._M_p != &local_210.val.field_2) {
      operator_delete(local_210.val._M_dataplus._M_p,local_210.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
  }
  uVar7 = (char *)0x0;
  uVar8 = 0;
  uVar9 = 0;
  t = Solver(script,(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&stack0xfffffffffffffce8);
  if (((char)uVar6 != '\0') &&
     (bVar5 = ExtractDestination(script,(CTxDestination *)&local_88._M_first), bVar5 && t != PUBKEY)
     ) {
    local_230[0] = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"address","");
    EncodeDestination_abi_cxx11_(&local_120,(CTxDestination *)&local_88._M_first);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_288,&local_120);
    key_02._M_string_length._4_4_ = uVar6;
    key_02._0_12_ = in_stack_fffffffffffffcd8;
    key_02.field_2._M_allocated_capacity = uVar7;
    key_02.field_2._8_8_ = uVar8;
    val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd00;
    val_02._0_8_ = uVar9;
    val_02.val._M_string_length = (size_type)in_stack_fffffffffffffd08._M_p;
    val_02.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd10;
    val_02.val.field_2._8_8_ = in_stack_fffffffffffffd18;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffd20._0_24_;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd20._24_24_;
    UniValue::pushKV(out,key_02,val_02);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_288.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.val._M_dataplus._M_p != &local_288.val.field_2) {
      operator_delete(local_288.val._M_dataplus._M_p,local_288.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_230[0] != local_220) {
      operator_delete(local_230[0],local_220[0] + 1);
    }
  }
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"type","");
  GetTxnOutputType_abi_cxx11_(&local_120,t);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)&stack0xfffffffffffffd00,&local_120);
  key_03._M_string_length._4_4_ = uVar6;
  key_03._0_12_ = in_stack_fffffffffffffcd8;
  key_03.field_2._M_allocated_capacity = uVar7;
  key_03.field_2._8_8_ = uVar8;
  val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd00;
  val_03._0_8_ = uVar9;
  val_03.val._M_string_length = (size_type)in_stack_fffffffffffffd08._M_p;
  val_03.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd10;
  val_03.val.field_2._8_8_ = in_stack_fffffffffffffd18;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffd20._0_24_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd20._24_24_;
  UniValue::pushKV(out,key_03,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffd40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffd28);
  if (in_stack_fffffffffffffd08._M_p != &stack0xfffffffffffffd18) {
    operator_delete(in_stack_fffffffffffffd08._M_p,in_stack_fffffffffffffd18 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&stack0xfffffffffffffce8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_88._M_first);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ScriptToUniv(const CScript& script, UniValue& out, bool include_hex, bool include_address, const SigningProvider* provider)
{
    CTxDestination address;

    out.pushKV("asm", ScriptToAsmStr(script));
    if (include_address) {
        out.pushKV("desc", InferDescriptor(script, provider ? *provider : DUMMY_SIGNING_PROVIDER)->ToString());
    }
    if (include_hex) {
        out.pushKV("hex", HexStr(script));
    }

    std::vector<std::vector<unsigned char>> solns;
    const TxoutType type{Solver(script, solns)};

    if (include_address && ExtractDestination(script, address) && type != TxoutType::PUBKEY) {
        out.pushKV("address", EncodeDestination(address));
    }
    out.pushKV("type", GetTxnOutputType(type));
}